

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall Am_Value_List_Data::Print(Am_Value_List_Data *this,ostream *os)

{
  ostream *poVar1;
  undefined1 local_30 [8];
  Am_Value v;
  Am_List_Item *current;
  ostream *os_local;
  Am_Value_List_Data *this_local;
  
  poVar1 = std::operator<<(os,"LIST(");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(uint)*(ushort *)&(this->super_Am_Wrapper).field_0xc);
  std::operator<<(poVar1,") [");
  Am_Value::Am_Value((Am_Value *)local_30);
  for (v.value = (anon_union_8_8_ea4c8939_for_value)this->head; v.value != this->tail;
      v.value = *(anon_union_8_8_ea4c8939_for_value *)(v.value.proc_value + 0x18)) {
    poVar1 = ::operator<<(os,(Am_Value *)v.value.wrapper_value);
    std::operator<<(poVar1,", ");
  }
  if (v.value.wrapper_value != (Am_Wrapper *)0x0) {
    ::operator<<(os,(Am_Value *)v.value.wrapper_value);
  }
  std::operator<<(os,"]");
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

void
Am_Value_List_Data::Print(std::ostream &os) const
{
  Am_List_Item *current;
  os << "LIST(" << (int)number << ") [";
  Am_Value v;
  for (current = head; current != tail; current = current->next) {
    os << *current << ", ";
  }
  if (current) {
    os << *current;
  }
  os << "]";
}